

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDElementDecl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DTDElementDecl::formatContentModel(DTDElementDecl *this)

{
  int iVar1;
  MemoryManager *pMVar2;
  undefined4 extraout_var;
  XMLCh *toRep;
  undefined1 local_50 [8];
  XMLBuffer bufFmt;
  XMLCh *newValue;
  DTDElementDecl *this_local;
  
  bufFmt.fBuffer = (XMLCh *)0x0;
  if (*(int *)&(this->super_XMLElementDecl).field_0x2c == 1) {
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    bufFmt.fBuffer = XMLString::replicate(L"ANY",pMVar2);
  }
  else if (*(int *)&(this->super_XMLElementDecl).field_0x2c == 0) {
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    bufFmt.fBuffer = XMLString::replicate((XMLCh *)XMLUni::fgEmptyString,pMVar2);
  }
  else {
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    XMLBuffer::XMLBuffer((XMLBuffer *)local_50,0x3ff,pMVar2);
    iVar1 = (*(this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[8])();
    ContentSpecNode::formatSpec
              ((ContentSpecNode *)CONCAT44(extraout_var,iVar1),(XMLBuffer *)local_50);
    toRep = XMLBuffer::getRawBuffer((XMLBuffer *)local_50);
    pMVar2 = XMLElementDecl::getMemoryManager(&this->super_XMLElementDecl);
    bufFmt.fBuffer = XMLString::replicate(toRep,pMVar2);
    XMLBuffer::~XMLBuffer((XMLBuffer *)local_50);
  }
  return bufFmt.fBuffer;
}

Assistant:

XMLCh* DTDElementDecl::formatContentModel() const
{
    XMLCh* newValue = 0;
    if (fModelType == Any)
    {
        newValue = XMLString::replicate(XMLUni::fgAnyString, getMemoryManager());
    }
     else if (fModelType == Empty)
    {
        newValue = XMLString::replicate(XMLUni::fgEmptyString, getMemoryManager());
    }
     else
    {
        //
        //  Use a temp XML buffer to format into. Content models could be
        //  pretty long, but very few will be longer than one K. The buffer
        //  will expand to handle the more pathological ones.
        //
        XMLBuffer bufFmt(1023, getMemoryManager());
        getContentSpec()->formatSpec(bufFmt);
        newValue = XMLString::replicate(bufFmt.getRawBuffer(), getMemoryManager());
    }
    return newValue;
}